

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(void)

{
  void *pvVar1;
  longlong t;
  timespec end;
  timespec start;
  uint local_10;
  uint j;
  uint i;
  
  clock_gettime(1,(timespec *)&end.tv_nsec);
  for (local_10 = 0; local_10 < 100000; local_10 = local_10 + 1) {
    for (start.tv_nsec._4_4_ = 0; start.tv_nsec._4_4_ < 9;
        start.tv_nsec._4_4_ = start.tv_nsec._4_4_ + 1) {
      if (p != (void *)0x0) {
        free(p);
      }
      p = malloc((long)sizes[start.tv_nsec._4_4_]);
    }
  }
  clock_gettime(1,(timespec *)&t);
  printf("%s, free+malloc:\n\t %lld\n","main",
         ((t - end.tv_nsec) * 1000000000 + end.tv_sec) - start.tv_sec);
  clock_gettime(1,(timespec *)&end.tv_nsec);
  for (local_10 = 0; local_10 < 100000; local_10 = local_10 + 1) {
    for (start.tv_nsec._4_4_ = 0; start.tv_nsec._4_4_ < 9;
        start.tv_nsec._4_4_ = start.tv_nsec._4_4_ + 1) {
      p = realloc(p,(long)sizes[start.tv_nsec._4_4_]);
    }
  }
  clock_gettime(1,(timespec *)&t);
  printf("%s, realloc:\n\t %lld\n","main",
         ((t - end.tv_nsec) * 1000000000 + end.tv_sec) - start.tv_sec);
  printf("\n");
  clock_gettime(1,(timespec *)&end.tv_nsec);
  for (local_10 = 0; local_10 < 100000; local_10 = local_10 + 1) {
    for (start.tv_nsec._4_4_ = 0; start.tv_nsec._4_4_ < 9;
        start.tv_nsec._4_4_ = start.tv_nsec._4_4_ + 1) {
      if (p != (void *)0x0) {
        free(p);
      }
      p = malloc((long)(sizes[start.tv_nsec._4_4_] << 0xe));
    }
  }
  clock_gettime(1,(timespec *)&t);
  printf("%s, free+malloc:\n\t %lld\n","main",
         ((t - end.tv_nsec) * 1000000000 + end.tv_sec) - start.tv_sec);
  clock_gettime(1,(timespec *)&end.tv_nsec);
  for (local_10 = 0; local_10 < 100000; local_10 = local_10 + 1) {
    for (start.tv_nsec._4_4_ = 0; start.tv_nsec._4_4_ < 9;
        start.tv_nsec._4_4_ = start.tv_nsec._4_4_ + 1) {
      p = realloc(p,(long)(sizes[start.tv_nsec._4_4_] << 0xe));
    }
  }
  clock_gettime(1,(timespec *)&t);
  printf("%s, realloc:\n\t %lld\n","main",
         ((t - end.tv_nsec) * 1000000000 + end.tv_sec) - start.tv_sec);
  printf("\n");
  clock_gettime(1,(timespec *)&end.tv_nsec);
  for (local_10 = 0; local_10 < 100000; local_10 = local_10 + 1) {
    for (start.tv_nsec._4_4_ = 0; start.tv_nsec._4_4_ < 9;
        start.tv_nsec._4_4_ = start.tv_nsec._4_4_ + 1) {
      p = realloc(p,(long)(sizes[start.tv_nsec._4_4_] << 0x14));
      p = realloc(p,(long)sizes[start.tv_nsec._4_4_]);
    }
  }
  clock_gettime(1,(timespec *)&t);
  printf("%s, realloc*2:\n\t %lld\n","main",
         ((t - end.tv_nsec) * 1000000000 + end.tv_sec) - start.tv_sec);
  clock_gettime(1,(timespec *)&end.tv_nsec);
  for (local_10 = 0; local_10 < 100000; local_10 = local_10 + 1) {
    for (start.tv_nsec._4_4_ = 0; start.tv_nsec._4_4_ < 9;
        start.tv_nsec._4_4_ = start.tv_nsec._4_4_ + 1) {
      if (p != (void *)0x0) {
        free(p);
      }
      p = malloc((long)(sizes[start.tv_nsec._4_4_] << 0x14));
      if (p != (void *)0x0) {
        free(p);
      }
      p = malloc((long)sizes[start.tv_nsec._4_4_]);
    }
  }
  clock_gettime(1,(timespec *)&t);
  printf("%s, free+malloc*2:\n\t %lld\n","main",
         ((t - end.tv_nsec) * 1000000000 + end.tv_sec) - start.tv_sec);
  printf("\n");
  clock_gettime(1,(timespec *)&end.tv_nsec);
  for (local_10 = 0; local_10 < 100000; local_10 = local_10 + 1) {
    for (start.tv_nsec._4_4_ = 0; start.tv_nsec._4_4_ < 9;
        start.tv_nsec._4_4_ = start.tv_nsec._4_4_ + 1) {
      p = realloc(p,(long)(sizes[start.tv_nsec._4_4_] << 0x14));
      p = realloc(p,(long)(sizes[start.tv_nsec._4_4_] << 10));
    }
  }
  clock_gettime(1,(timespec *)&t);
  printf("%s, realloc*2:\n\t %lld\n","main",
         ((t - end.tv_nsec) * 1000000000 + end.tv_sec) - start.tv_sec);
  clock_gettime(1,(timespec *)&end.tv_nsec);
  for (local_10 = 0; local_10 < 100000; local_10 = local_10 + 1) {
    for (start.tv_nsec._4_4_ = 0; start.tv_nsec._4_4_ < 9;
        start.tv_nsec._4_4_ = start.tv_nsec._4_4_ + 1) {
      if (p != (void *)0x0) {
        free(p);
      }
      p = malloc((long)(sizes[start.tv_nsec._4_4_] << 0x14));
      if (p != (void *)0x0) {
        free(p);
      }
      p = malloc((long)(sizes[start.tv_nsec._4_4_] << 10));
    }
  }
  clock_gettime(1,(timespec *)&t);
  printf("%s, free+malloc*2:\n\t %lld\n","main",
         ((t - end.tv_nsec) * 1000000000 + end.tv_sec) - start.tv_sec);
  printf("\n");
  clock_gettime(1,(timespec *)&end.tv_nsec);
  for (local_10 = 0; local_10 < 100000; local_10 = local_10 + 1) {
    for (start.tv_nsec._4_4_ = 0; start.tv_nsec._4_4_ < 9;
        start.tv_nsec._4_4_ = start.tv_nsec._4_4_ + 1) {
      p = realloc(p,(long)(sizes[start.tv_nsec._4_4_] << 0x14));
    }
  }
  clock_gettime(1,(timespec *)&t);
  printf("%s, realloc:\n\t %lld\n","main",
         ((t - end.tv_nsec) * 1000000000 + end.tv_sec) - start.tv_sec);
  clock_gettime(1,(timespec *)&end.tv_nsec);
  for (local_10 = 0; local_10 < 100000; local_10 = local_10 + 1) {
    for (start.tv_nsec._4_4_ = 0; start.tv_nsec._4_4_ < 9;
        start.tv_nsec._4_4_ = start.tv_nsec._4_4_ + 1) {
      if (p != (void *)0x0) {
        free(p);
      }
      p = malloc((long)(sizes[start.tv_nsec._4_4_] << 0x14));
    }
  }
  clock_gettime(1,(timespec *)&t);
  printf("%s, free+malloc:\n\t %lld\n","main",
         ((t - end.tv_nsec) * 1000000000 + end.tv_sec) - start.tv_sec);
  printf("\n");
  clock_gettime(1,(timespec *)&end.tv_nsec);
  for (local_10 = 0; local_10 < 0x4000; local_10 = local_10 + 1) {
    pvVar1 = malloc(0x2000);
    pages[local_10] = pvVar1;
  }
  clock_gettime(1,(timespec *)&t);
  printf("%s, pages:\n\t %lld\n","main",((t - end.tv_nsec) * 1000000000 + end.tv_sec) - start.tv_sec
        );
  for (local_10 = 0; local_10 < 0x4000; local_10 = local_10 + 1) {
    free(pages[local_10]);
  }
  clock_gettime(1,(timespec *)&end.tv_nsec);
  p = realloc(p,0x5554000);
  for (local_10 = 0x2aab; local_10 < 0x4001; local_10 = local_10 + 1) {
    p = realloc(p,(ulong)(local_10 << 0xd));
  }
  clock_gettime(1,(timespec *)&t);
  printf("%s, realloc:\n\t %lld\n","main",
         ((t - end.tv_nsec) * 1000000000 + end.tv_sec) - start.tv_sec);
  free(p);
  clock_gettime(1,(timespec *)&end.tv_nsec);
  p = malloc(0x18000000);
  p = realloc(p,0x8000000);
  clock_gettime(1,(timespec *)&t);
  printf("%s, shrink:\n\t %lld\n","main",
         ((t - end.tv_nsec) * 1000000000 + end.tv_sec) - start.tv_sec);
  free(p);
  return 0;
}

Assistant:

int
main()
{
    unsigned int i, j;
    struct timespec start, end;
    long long t;
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        for (j = 0;j < sizeof(sizes) / sizeof(int);j++) {
            if (p)
                free(p);
            p = malloc(sizes[j]);
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, free+malloc:\n\t %lld\n", __func__, t);
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        for (j = 0;j < sizeof(sizes) / sizeof(int);j++) {
            p = realloc(p, sizes[j]);
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, realloc:\n\t %lld\n", __func__, t);
    printf("\n");

    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        for (j = 0;j < sizeof(sizes) / sizeof(int);j++) {
            if (p)
                free(p);
            p = malloc(sizes[j] * 16 * 1024);
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, free+malloc:\n\t %lld\n", __func__, t);
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        for (j = 0;j < sizeof(sizes) / sizeof(int);j++) {
            p = realloc(p, sizes[j] * 16 * 1024);
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, realloc:\n\t %lld\n", __func__, t);
    printf("\n");

    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        for (j = 0;j < sizeof(sizes) / sizeof(int);j++) {
            p = realloc(p, sizes[j] * 1024 * 1024);
            p = realloc(p, sizes[j]);
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, realloc*2:\n\t %lld\n", __func__, t);
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        for (j = 0;j < sizeof(sizes) / sizeof(int);j++) {
            if (p)
                free(p);
            p = malloc(sizes[j] * 1024 * 1024);
            if (p)
                free(p);
            p = malloc(sizes[j]);
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, free+malloc*2:\n\t %lld\n", __func__, t);
    printf("\n");

    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        for (j = 0;j < sizeof(sizes) / sizeof(int);j++) {
            p = realloc(p, sizes[j] * 1024 * 1024);
            p = realloc(p, sizes[j] * 1024);
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, realloc*2:\n\t %lld\n", __func__, t);
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        for (j = 0;j < sizeof(sizes) / sizeof(int);j++) {
            if (p)
                free(p);
            p = malloc(sizes[j] * 1024 * 1024);
            if (p)
                free(p);
            p = malloc(sizes[j] * 1024);
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, free+malloc*2:\n\t %lld\n", __func__, t);
    printf("\n");

    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        for (j = 0;j < sizeof(sizes) / sizeof(int);j++) {
            p = realloc(p, sizes[j] * 1024 * 1024);
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, realloc:\n\t %lld\n", __func__, t);
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        for (j = 0;j < sizeof(sizes) / sizeof(int);j++) {
            if (p)
                free(p);
            p = malloc(sizes[j] * 1024 * 1024);
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, free+malloc:\n\t %lld\n", __func__, t);
    printf("\n");

    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < PAGE_COUNT;i++) {
        pages[i] = malloc(PAGE_SIZE);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, pages:\n\t %lld\n", __func__, t);
    for (i = 0;i < PAGE_COUNT;i++) {
        free(pages[i]);
    }

    clock_gettime(CLOCK_ID, &start);
    p = realloc(p, PAGE_INIT * PAGE_SIZE);
    for (i = PAGE_INIT + 1;i <= PAGE_COUNT;i++) {
        p = realloc(p, PAGE_SIZE * i);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, realloc:\n\t %lld\n", __func__, t);
    free(p);

    clock_gettime(CLOCK_ID, &start);
    p = malloc(PAGE_COUNT * PAGE_SIZE * 3);
    p = realloc(p, PAGE_COUNT * PAGE_SIZE);
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, shrink:\n\t %lld\n", __func__, t);

    free(p);
    return 0;
}